

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_rsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  int iVar2;
  uchar *type;
  size_t type_len;
  size_t n_len;
  size_t e_len;
  uchar *n;
  uchar *e;
  EVP_PKEY *rsactx;
  string_buf buf;
  uchar *local_70;
  size_t local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  uchar *local_50;
  uchar *local_48;
  EVP_PKEY *local_40;
  string_buf local_38;
  
  if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar2 = -1;
  if (((0x12 < hostkey_data_len) &&
      (local_38.data = hostkey_data, local_38.dataptr = hostkey_data,
      local_38.len = hostkey_data_len, iVar1 = _libssh2_get_string(&local_38,&local_70,&local_68),
      iVar1 == 0)) &&
     ((((local_68 == 7 && (iVar1 = strncmp("ssh-rsa",(char *)local_70,7), iVar1 == 0)) ||
       ((local_68 == 0xc &&
        ((iVar1 = strncmp("rsa-sha2-256",(char *)local_70,0xc), iVar1 == 0 ||
         (iVar1 = strncmp("rsa-sha2-512",(char *)local_70,0xc), iVar1 == 0)))))) &&
      ((iVar1 = _libssh2_get_string(&local_38,&local_48,&local_58), iVar1 == 0 &&
       (((iVar1 = _libssh2_get_string(&local_38,&local_50,&local_60), iVar1 == 0 &&
         (iVar1 = _libssh2_eob(&local_38), iVar1 != 0)) &&
        (iVar1 = _libssh2_rsa_new(&local_40,local_48,local_58,local_50,local_60,(uchar *)0x0,0,
                                  (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                                  (uchar *)0x0,0), iVar1 == 0)))))))) {
    *abstract = local_40;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    unsigned char *e, *n, *type;
    size_t e_len, n_len, type_len;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 19) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)LIBSSH2_UNCONST(hostkey_data);
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_get_string(&buf, &type, &type_len)) {
        return -1;
    }

    /* we accept one of 3 header types */
#if LIBSSH2_RSA_SHA1
    if(type_len == 7 && strncmp("ssh-rsa", (char *)type, 7) == 0) {
        /* ssh-rsa */
    }
    else
#endif
#if LIBSSH2_RSA_SHA2
    if(type_len == 12 && strncmp("rsa-sha2-256", (char *)type, 12) == 0) {
        /* rsa-sha2-256 */
    }
    else if(type_len == 12 && strncmp("rsa-sha2-512", (char *)type, 12) == 0) {
        /* rsa-sha2-512 */
    }
    else
#endif
    {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "unexpected rsa type: %.*s", (int)type_len, type));
        return -1;
    }

    if(_libssh2_get_string(&buf, &e, &e_len))
        return -1;

    if(_libssh2_get_string(&buf, &n, &n_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_rsa_new(&rsactx,
                        e, (unsigned long)e_len,
                        n, (unsigned long)n_len,
                        NULL, 0, NULL, 0, NULL, 0,
                        NULL, 0, NULL, 0, NULL, 0)) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}